

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGen::RccLister::list
          (RccLister *this,string *qrcFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *error,bool verbose)

{
  pointer pcVar1;
  uint uVar2;
  pointer pbVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  istream *piVar7;
  long lVar8;
  undefined8 uVar9;
  string *entry;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *string;
  pointer pbVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string rccStdOut;
  string rccStdErr;
  int retVal;
  string fileDir;
  ostringstream osst;
  string msg;
  undefined1 local_458 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  string local_418;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  string local_3d0;
  undefined1 local_3b0 [80];
  char *local_360;
  char *local_358;
  ios_base local_340 [48];
  char *local_310;
  char *local_2f0;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  uint auStack_218 [12];
  char *local_1e8;
  char *local_1e0;
  ios_base local_1c0 [40];
  char *local_198;
  char *local_178;
  
  error->_M_string_length = 0;
  *(error->_M_dataplus)._M_p = '\0';
  local_3f8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files;
  bVar4 = cmsys::SystemTools::FileExists(qrcFile,true);
  if (!bVar4) {
    std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x5d16a5);
    Quoted((string *)local_238,qrcFile);
    std::__cxx11::string::_M_append((char *)error,local_238._0_8_);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)error);
    return false;
  }
  cmsys::SystemTools::GetFilenamePath(&local_3d0,qrcFile);
  if ((((this->RccExcutable_)._M_string_length == 0) ||
      (bVar4 = cmsys::SystemTools::FileExists(&this->RccExcutable_,true), !bVar4)) ||
     ((this->ListOptions_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->ListOptions_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    local_3e8 = 0;
    local_3e0._M_local_buf[0] = '\0';
    local_3f0 = &local_3e0;
    std::ifstream::ifstream(local_238,(qrcFile->_M_dataplus)._M_p,_S_in);
    uVar2 = *(uint *)((long)auStack_218 + *(long *)(local_238._0_8_ + -0x18));
    if ((uVar2 & 5) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::ostream::operator<<(local_3b0,(streambuf *)(local_238 + 0x10));
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_3f0,(string *)local_458);
      if ((pointer)local_458._0_8_ != (pointer)(local_458 + 0x10)) {
        operator_delete((void *)local_458._0_8_,(ulong)(local_458._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
    }
    else {
      std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x5d16a5);
      Quoted((string *)local_3b0,qrcFile);
      std::__cxx11::string::_M_append((char *)error,local_3b0._0_8_);
      if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
        operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
      }
      std::__cxx11::string::append((char *)error);
    }
    std::ifstream::~ifstream(local_238);
    if ((uVar2 & 5) == 0) {
      local_238._0_8_ = (pointer)0x0;
      local_1e8 = (char *)0x0;
      local_198 = (char *)0x0;
      local_178 = (char *)0x0;
      cmsys::RegularExpression::compile((RegularExpression *)local_238,"(<file[^<]+)");
      local_3b0._0_8_ = (pointer)0x0;
      local_360 = (char *)0x0;
      local_310 = (char *)0x0;
      local_2f0 = (char *)0x0;
      cmsys::RegularExpression::compile((RegularExpression *)local_3b0,"(^<file[^>]*>)");
      string = local_3f0;
      while (bVar4 = cmsys::RegularExpression::find
                               ((RegularExpression *)local_238,string->_M_local_buf,
                                (RegularExpressionMatch *)local_238), bVar4) {
        if ((char *)local_238._8_8_ == (char *)0x0) {
          local_458._0_8_ = local_458 + 0x10;
          local_458._8_8_ = (pointer)0x0;
          local_458._16_8_ = local_458._16_8_ & 0xffffffffffffff00;
        }
        else {
          local_458._0_8_ = local_458 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_458,local_238._8_8_,local_1e0);
        }
        string = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(string->_M_local_buf + local_458._8_8_);
        cmsys::RegularExpression::find
                  ((RegularExpression *)local_3b0,(char *)local_458._0_8_,
                   (RegularExpressionMatch *)local_3b0);
        local_438._M_allocated_capacity = (size_type)&local_428;
        if ((char *)local_3b0._8_8_ == (char *)0x0) {
          local_438._8_8_ = 0;
          local_428._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_438,local_3b0._8_8_,local_358);
        }
        std::__cxx11::string::substr((ulong)&local_418,(ulong)local_458);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_3f8,&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p,
                          CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                                   local_418.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_allocated_capacity != &local_428) {
          operator_delete((void *)local_438._M_allocated_capacity,
                          CONCAT71(local_428._M_allocated_capacity._1_7_,local_428._M_local_buf[0])
                          + 1);
        }
        if ((pointer)local_458._0_8_ != (pointer)(local_458 + 0x10)) {
          operator_delete((void *)local_458._0_8_,(ulong)(local_458._16_8_ + 1));
        }
      }
      if (local_2f0 != (char *)0x0) {
        operator_delete__(local_2f0);
      }
      if (local_178 != (char *)0x0) {
        operator_delete__(local_178);
      }
      if (local_3f0 != &local_3e0) {
        operator_delete(local_3f0,
                        CONCAT71(local_3e0._M_allocated_capacity._1_7_,local_3e0._M_local_buf[0]) +
                        1);
      }
LAB_004031e5:
      pbVar10 = *(pointer *)local_3f8;
      pbVar3 = *(pointer *)(local_3f8 + 8);
      bVar4 = true;
      if (pbVar10 != pbVar3) {
        do {
          cmsys::SystemTools::CollapseFullPath((string *)local_238,pbVar10,&local_3d0);
          std::__cxx11::string::operator=((string *)pbVar10,(string *)local_238);
          if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
            operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 != pbVar3);
      }
      goto LAB_0040324f;
    }
    if (local_3f0 != &local_3e0) {
      lVar8 = CONCAT71(local_3e0._M_allocated_capacity._1_7_,local_3e0._M_local_buf[0]);
      uVar9 = local_3f0;
      goto LAB_00402bda;
    }
  }
  else {
    local_3f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((ulong)local_3f0._4_4_ << 0x20);
    local_438._8_8_ = 0;
    local_428._M_local_buf[0] = '\0';
    local_418._M_string_length = 0;
    local_418.field_2._M_local_buf[0] = '\0';
    local_458._16_8_ = (pointer)0x0;
    local_458._0_8_ = (pointer)0x0;
    local_458._8_8_ = (pointer)0x0;
    local_438._M_allocated_capacity = (size_type)&local_428;
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_458,
               &this->RccExcutable_);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_458,
               local_458._8_8_,
               (this->ListOptions_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->ListOptions_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    cmsys::SystemTools::GetFilenameName((string *)local_238,qrcFile);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_458,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    pcVar1 = local_238 + 0x10;
    if ((pointer)local_238._0_8_ != pcVar1) {
      operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
    }
    if (verbose) {
      local_238._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Running command:\n","");
      QuotedCommand((string *)local_3b0,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_458);
      std::__cxx11::string::_M_append(local_238,local_3b0._0_8_);
      if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
        operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
      }
      std::__cxx11::string::push_back((char)local_238);
      cmSystemTools::Stdout((string *)local_238);
      if ((pointer)local_238._0_8_ != pcVar1) {
        operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
      }
    }
    bVar4 = cmSystemTools::RunSingleCommand
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_458,(string *)&local_438,&local_418,(int *)&local_3f0,
                       local_3d0._M_dataplus._M_p,OUTPUT_NONE,(cmDuration)0x0,Auto);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_458);
    if (bVar4 && (int)local_3f0 == 0) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_238,(string *)local_438._M_local_buf,_S_in);
      pbVar10 = (pointer)(local_458 + 0x10);
      local_458._8_8_ = (pointer)0x0;
      local_458._16_8_ = local_458._16_8_ & 0xffffffffffffff00;
      local_458._0_8_ = pbVar10;
      while( true ) {
        cVar5 = std::ios::widen((char)*(undefined8 *)(local_238._0_8_ + -0x18) +
                                (char)(istringstream *)local_238);
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)local_458,cVar5);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
        lVar8 = std::__cxx11::string::find((char)(value_type *)local_458,0xd);
        if (lVar8 != -1) {
          std::__cxx11::string::substr((ulong)local_3b0,(ulong)local_458);
          std::__cxx11::string::operator=((string *)local_458,(string *)local_3b0);
          if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
            operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
          }
        }
        if ((pointer)local_458._8_8_ != (pointer)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3f8,(value_type *)local_458);
        }
      }
      if ((pointer)local_458._0_8_ != pbVar10) {
        operator_delete((void *)local_458._0_8_,(ulong)(local_458._16_8_ + 1));
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_238);
      std::ios_base::~ios_base(local_1c0);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_238,(string *)&local_418,_S_in);
      local_458._8_8_ = (pointer)0x0;
      local_458._16_8_ = local_458._16_8_ & 0xffffffffffffff00;
      local_458._0_8_ = pbVar10;
      do {
        do {
          cVar5 = std::ios::widen((char)*(undefined8 *)(local_238._0_8_ + -0x18) +
                                  (char)(istream *)local_238);
          piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_238,(string *)local_458,cVar5);
          uVar2 = *(uint *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18) + 0x20);
          if ((uVar2 & 5) != 0) goto LAB_00403166;
          lVar8 = std::__cxx11::string::find((char)(string *)local_458,0xd);
          if (lVar8 != -1) {
            std::__cxx11::string::substr((ulong)local_3b0,(ulong)local_458);
            std::__cxx11::string::operator=((string *)local_458,(string *)local_3b0);
            if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
              operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
            }
          }
          iVar6 = strncmp((char *)local_458._0_8_,"RCC: Error in",0xd);
        } while (iVar6 != 0);
        if ((RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
             ::searchString_abi_cxx11_ == '\0') &&
           (iVar6 = __cxa_guard_acquire(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                                         ::searchString_abi_cxx11_), iVar6 != 0)) {
          RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
          ::searchString_abi_cxx11_ = &DAT_0072ba28;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                      ::searchString_abi_cxx11_,"Cannot find file \'","");
          __cxa_atexit(std::__cxx11::string::~string,
                       &RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                        ::searchString_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                               ::searchString_abi_cxx11_);
        }
        lVar8 = std::__cxx11::string::find
                          ((char *)local_458,
                           (ulong)RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                                  ::searchString_abi_cxx11_,0);
        if (lVar8 == -1) {
          std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x5d171e);
          Quoted((string *)local_3b0,(string *)local_458);
          std::__cxx11::string::_M_append((char *)error,local_3b0._0_8_);
          if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
            operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
          }
          std::__cxx11::string::append((char *)error);
        }
        else {
          std::__cxx11::string::substr((ulong)local_3b0,(ulong)local_458);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_3f8,(string *)local_3b0);
          if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
            operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
          }
        }
      } while (lVar8 != -1);
LAB_00403166:
      if ((pointer)local_458._0_8_ != (pointer)(local_458 + 0x10)) {
        operator_delete((void *)local_458._0_8_,(ulong)(local_458._16_8_ + 1));
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_238);
      std::ios_base::~ios_base(local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p,
                        CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                                 local_418.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_allocated_capacity != &local_428) {
        operator_delete((void *)local_438._M_allocated_capacity,
                        CONCAT71(local_428._M_allocated_capacity._1_7_,local_428._M_local_buf[0]) +
                        1);
      }
      if ((uVar2 & 5) != 0) goto LAB_004031e5;
    }
    else {
      std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x5d16ca);
      Quoted((string *)local_238,qrcFile);
      std::__cxx11::string::_M_append((char *)error,local_238._0_8_);
      if ((pointer)local_238._0_8_ != pcVar1) {
        operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)error);
      if (local_438._8_8_ != 0) {
        std::__cxx11::string::_M_append((char *)error,local_438._M_allocated_capacity);
        std::__cxx11::string::append((char *)error);
      }
      if (local_418._M_string_length != 0) {
        std::__cxx11::string::_M_append((char *)error,(ulong)local_418._M_dataplus._M_p);
        std::__cxx11::string::append((char *)error);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p,
                        CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                                 local_418.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_allocated_capacity != &local_428) {
        lVar8 = CONCAT71(local_428._M_allocated_capacity._1_7_,local_428._M_local_buf[0]);
        uVar9 = local_438._M_allocated_capacity;
LAB_00402bda:
        operator_delete((void *)uVar9,lVar8 + 1);
      }
    }
  }
  bVar4 = false;
LAB_0040324f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmQtAutoGen::RccLister::list(std::string const& qrcFile,
                                  std::vector<std::string>& files,
                                  std::string& error, bool verbose) const
{
  error.clear();

  if (!cmSystemTools::FileExists(qrcFile, true)) {
    error = "The resource file ";
    error += Quoted(qrcFile);
    error += " does not exist.";
    return false;
  }

  // Run rcc list command in the directory of the qrc file with the pathless
  // qrc file name argument.  This way rcc prints relative paths.
  // This avoids issues on Windows when the qrc file is in a path that
  // contains non-ASCII characters.
  std::string const fileDir = cmSystemTools::GetFilenamePath(qrcFile);

  if (!this->RccExcutable_.empty() &&
      cmSystemTools::FileExists(this->RccExcutable_, true) &&
      !this->ListOptions_.empty()) {

    bool result = false;
    int retVal = 0;
    std::string rccStdOut;
    std::string rccStdErr;
    {
      std::vector<std::string> cmd;
      cmd.emplace_back(this->RccExcutable_);
      cmAppend(cmd, this->ListOptions_);
      cmd.emplace_back(cmSystemTools::GetFilenameName(qrcFile));

      // Log command
      if (verbose) {
        std::string msg = "Running command:\n";
        msg += QuotedCommand(cmd);
        msg += '\n';
        cmSystemTools::Stdout(msg);
      }

      result = cmSystemTools::RunSingleCommand(
        cmd, &rccStdOut, &rccStdErr, &retVal, fileDir.c_str(),
        cmSystemTools::OUTPUT_NONE, cmDuration::zero(), cmProcessOutput::Auto);
    }
    if (!result || retVal) {
      error = "The rcc list process failed for ";
      error += Quoted(qrcFile);
      error += "\n";
      if (!rccStdOut.empty()) {
        error += rccStdOut;
        error += "\n";
      }
      if (!rccStdErr.empty()) {
        error += rccStdErr;
        error += "\n";
      }
      return false;
    }
    if (!RccListParseOutput(rccStdOut, rccStdErr, files, error)) {
      return false;
    }
  } else {
    // We can't use rcc for the file listing.
    // Read the qrc file content into string and parse it.
    {
      std::string qrcContents;
      {
        cmsys::ifstream ifs(qrcFile.c_str());
        if (ifs) {
          std::ostringstream osst;
          osst << ifs.rdbuf();
          qrcContents = osst.str();
        } else {
          error = "The resource file ";
          error += Quoted(qrcFile);
          error += " is not readable\n";
          return false;
        }
      }
      // Parse string content
      RccListParseContent(qrcContents, files);
    }
  }

  // Convert relative paths to absolute paths
  for (std::string& entry : files) {
    entry = cmSystemTools::CollapseFullPath(entry, fileDir);
  }
  return true;
}